

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

bool fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned__int128,char>
               (appender *out,unsigned___int128 value,uint prefix,basic_format_specs<char> *specs,
               locale_ref loc)

{
  char cVar1;
  undefined1 n_00 [16];
  undefined1 value_00 [16];
  locale_ref loc_00;
  appender out_00;
  bool bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  reference pcVar6;
  size_t sVar7;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> bVar8;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> *in_RDI;
  char *data;
  int i;
  char *p;
  int digit_index;
  basic_string_view<char> s;
  type usize;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char digits [40];
  const_iterator group;
  string *groups;
  int n;
  int size;
  int num_digits;
  thousands_sep_result<char> ts;
  int sep_size;
  allocator<char> *in_stack_fffffffffffffbf8;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffc00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffc08;
  char *p_00;
  undefined8 in_stack_fffffffffffffc38;
  int iVar9;
  undefined8 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc4c;
  uint in_stack_fffffffffffffc58;
  anon_class_16_2_3f014a30 *in_stack_fffffffffffffc78;
  size_t in_stack_fffffffffffffc88;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  char *local_360;
  int local_34c;
  undefined1 local_348 [24];
  buffer<char> local_330 [16];
  format_decimal_result<char_*> local_118;
  undefined8 local_108;
  undefined8 local_100;
  char local_f8 [40];
  undefined8 local_d0;
  undefined8 local_c8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  undefined1 *local_b8;
  int local_ac;
  int local_a8;
  undefined8 local_98;
  undefined8 local_90;
  int local_88;
  undefined4 local_84;
  undefined1 local_78 [32];
  char local_58 [12];
  undefined4 local_4c;
  int local_3c;
  undefined8 local_38;
  undefined8 local_30;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> *local_28;
  byte local_1;
  
  local_4c = 1;
  loc_00.locale_._4_4_ = in_stack_fffffffffffffc4c;
  loc_00.locale_._0_4_ = in_stack_fffffffffffffc48;
  local_3c = in_ECX;
  local_38 = in_RSI;
  local_30 = in_RDX;
  local_28 = in_RDI;
  thousands_sep<char>(loc_00);
  if (local_58[0] == '\0') {
    local_1 = 0;
    local_84 = 1;
  }
  else {
    local_90 = local_30;
    local_98 = local_38;
    n_00._8_8_ = in_stack_fffffffffffffc08;
    n_00._0_8_ = in_stack_fffffffffffffc00;
    iVar4 = count_digits((uint128_t)n_00);
    local_b8 = local_78;
    local_ac = iVar4;
    local_a8 = iVar4;
    local_88 = iVar4;
    local_c0._M_current = (char *)std::__cxx11::string::cbegin();
    while( true ) {
      local_c8 = std::__cxx11::string::cend();
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffc00,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffbf8);
      iVar9 = local_ac;
      in_stack_fffffffffffffc58 = in_stack_fffffffffffffc58 & 0xffffff;
      if (bVar2) {
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_c0);
        in_stack_fffffffffffffc58 = in_stack_fffffffffffffc58 & 0xffffff;
        if (*pcVar6 < iVar9) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_c0);
          in_stack_fffffffffffffc58 = in_stack_fffffffffffffc58 & 0xffffff;
          if ('\0' < *pcVar6) {
            pcVar6 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_c0);
            cVar1 = *pcVar6;
            cVar3 = max_value<char>();
            in_stack_fffffffffffffc58 = CONCAT13(cVar1 != cVar3,(int3)in_stack_fffffffffffffc58);
          }
        }
      }
      iVar9 = (int)((ulong)in_stack_fffffffffffffc38 >> 0x20);
      if ((char)(in_stack_fffffffffffffc58 >> 0x18) == '\0') break;
      local_a8 = local_a8 + 1;
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_c0);
      local_ac = local_ac - *pcVar6;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_c0);
    }
    local_d0 = std::__cxx11::string::cend();
    bVar2 = __gnu_cxx::operator==
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffc00,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffbf8);
    if (bVar2) {
      in_stack_fffffffffffffc4c = local_ac + -1;
      pcVar5 = (char *)std::__cxx11::string::back();
      local_a8 = in_stack_fffffffffffffc4c / (int)*pcVar5 + local_a8;
    }
    local_100 = local_30;
    local_108 = local_38;
    value_00._8_4_ = in_stack_fffffffffffffc48;
    value_00._0_8_ = in_stack_fffffffffffffc40;
    value_00._12_4_ = in_stack_fffffffffffffc4c;
    local_118 = format_decimal<char,unsigned__int128>
                          ((char *)CONCAT44(iVar4,in_stack_fffffffffffffc58),
                           (unsigned___int128)value_00,iVar9);
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    std::allocator<char>::~allocator((allocator<char> *)(local_348 + 0x17));
    if (local_3c != 0) {
      local_a8 = local_a8 + 1;
    }
    local_348._16_4_ = to_unsigned<int>(0);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::resize
              (in_stack_fffffffffffffc00,(size_t)in_stack_fffffffffffffbf8);
    basic_string_view<char>::basic_string_view((basic_string_view<char> *)local_348,local_58,1);
    local_34c = 0;
    local_c0._M_current = (char *)std::__cxx11::string::cbegin();
    pcVar5 = buffer<char>::data(local_330);
    local_360 = pcVar5 + (long)local_a8 + -1;
    iVar4 = local_88;
    while (iVar4 = iVar4 + -1, 0 < iVar4) {
      pcVar5 = local_360 + -1;
      *local_360 = local_f8[iVar4];
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_c0);
      local_360 = pcVar5;
      if ('\0' < *pcVar6) {
        local_34c = local_34c + 1;
        pcVar6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_c0);
        if (local_34c % (int)*pcVar6 == 0) {
          pcVar6 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_c0);
          cVar1 = *pcVar6;
          cVar3 = max_value<char>();
          if (cVar1 != cVar3) {
            in_stack_fffffffffffffc90 =
                 __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(in_stack_fffffffffffffc08,(difference_type)in_stack_fffffffffffffc00);
            in_stack_fffffffffffffc88 = std::__cxx11::string::cend();
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffc00,
                               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)in_stack_fffffffffffffbf8);
            if (bVar2) {
              local_34c = 0;
              __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++(&local_c0);
            }
            in_stack_fffffffffffffc00 =
                 (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_348;
            basic_string_view<char>::data((basic_string_view<char> *)in_stack_fffffffffffffc00);
            in_stack_fffffffffffffc08 =
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)basic_string_view<char>::data
                              ((basic_string_view<char> *)in_stack_fffffffffffffc00);
            basic_string_view<char>::size((basic_string_view<char> *)in_stack_fffffffffffffc00);
            p_00 = pcVar5;
            sVar7 = basic_string_view<char>::size
                              ((basic_string_view<char> *)in_stack_fffffffffffffc00);
            make_checked<char>(p_00,sVar7);
            std::uninitialized_copy<char_const*,char*>
                      (p_00,(char *)in_stack_fffffffffffffc08,(char *)in_stack_fffffffffffffc00);
            sVar7 = basic_string_view<char>::size((basic_string_view<char> *)local_348);
            local_360 = pcVar5 + -sVar7;
          }
        }
      }
    }
    *local_360 = local_f8[0];
    if (local_3c != 0) {
      local_360[-1] = (char)local_3c;
    }
    pcVar5 = buffer<char>::data(local_330);
    out_00.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ = iVar4;
    out_00.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ =
         in_stack_fffffffffffffc98;
    bVar8.container =
         (buffer<char> *)
         write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned__int128,char>(fmt::v8::appender&,unsigned__int128,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::locale_ref)::_lambda(fmt::v8::appender)_1_>
                   (out_00,(basic_format_specs<char> *)in_stack_fffffffffffffc90._M_current,
                    in_stack_fffffffffffffc88,(size_t)pcVar5,in_stack_fffffffffffffc78);
    local_28->container = bVar8.container;
    local_1 = 1;
    local_84 = 1;
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
              (in_stack_fffffffffffffc00);
  }
  thousands_sep_result<char>::~thousands_sep_result((thousands_sep_result<char> *)0x135dfb);
  return (bool)(local_1 & 1);
}

Assistant:

auto write_int_localized(OutputIt& out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs, locale_ref loc)
    -> bool {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  const auto sep_size = 1;
  auto ts = thousands_sep<Char>(loc);
  if (!ts.thousands_sep) return false;
  int num_digits = count_digits(value);
  int size = num_digits, n = num_digits;
  const std::string& groups = ts.grouping;
  std::string::const_iterator group = groups.cbegin();
  while (group != groups.cend() && n > *group && *group > 0 &&
         *group != max_value<char>()) {
    size += sep_size;
    n -= *group;
    ++group;
  }
  if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
  char digits[40];
  format_decimal(digits, value, num_digits);
  basic_memory_buffer<Char> buffer;
  if (prefix != 0) ++size;
  const auto usize = to_unsigned(size);
  buffer.resize(usize);
  basic_string_view<Char> s(&ts.thousands_sep, sep_size);
  // Index of a decimal digit with the least significant digit having index 0.
  int digit_index = 0;
  group = groups.cbegin();
  auto p = buffer.data() + size - 1;
  for (int i = num_digits - 1; i > 0; --i) {
    *p-- = static_cast<Char>(digits[i]);
    if (*group <= 0 || ++digit_index % *group != 0 ||
        *group == max_value<char>())
      continue;
    if (group + 1 != groups.cend()) {
      digit_index = 0;
      ++group;
    }
    std::uninitialized_copy(s.data(), s.data() + s.size(),
                            make_checked(p, s.size()));
    p -= s.size();
  }
  *p-- = static_cast<Char>(*digits);
  if (prefix != 0) *p = static_cast<Char>(prefix);
  auto data = buffer.data();
  out = write_padded<align::right>(
      out, specs, usize, usize, [=](reserve_iterator<OutputIt> it) {
        return copy_str<Char>(data, data + size, it);
      });
  return true;
}